

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase455::~TestCase455(TestCase455 *this)

{
  TestCase455 *this_local;
  
  kj::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TEST(Serialize, RejectTooManySegments) {
  kj::Array<word> data = kj::heapArray<word>(8192);
  WireValue<uint32_t>* table = reinterpret_cast<WireValue<uint32_t>*>(data.begin());
  table[0].set(1024);
  for (uint i = 0; i < 1024; i++) {
    table[i+1].set(1);
  }
  TestInputStream input(data.asPtr(), false);

  kj::Maybe<kj::Exception> e = kj::runCatchingExceptions([&]() {
    InputStreamMessageReader reader(input);
#if !KJ_NO_EXCEPTIONS
    ADD_FAILURE() << "Should have thrown an exception.";
#endif
  });

  KJ_EXPECT(e != nullptr, "Should have thrown an exception.");
}